

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

xmlDtdPtr xmlNewDtd(xmlDocPtr doc,xmlChar *name,xmlChar *ExternalID,xmlChar *SystemID)

{
  xmlChar *pxVar1;
  xmlRegisterNodeFunc *pp_Var2;
  xmlDtdPtr cur;
  xmlChar *SystemID_local;
  xmlChar *ExternalID_local;
  xmlChar *name_local;
  xmlDocPtr doc_local;
  
  if ((doc != (xmlDocPtr)0x0) && (doc->extSubset != (_xmlDtd *)0x0)) {
    return (xmlDtdPtr)0x0;
  }
  doc_local = (xmlDocPtr)(*xmlMalloc)(0x80);
  if (doc_local == (xmlDocPtr)0x0) {
    return (xmlDtdPtr)0x0;
  }
  memset(doc_local,0,0x80);
  doc_local->type = XML_DTD_NODE;
  if (name == (xmlChar *)0x0) {
LAB_00160d05:
    if (ExternalID != (xmlChar *)0x0) {
      pxVar1 = xmlStrdup(ExternalID);
      doc_local->version = pxVar1;
      if (doc_local->version == (xmlChar *)0x0) goto LAB_00160da4;
    }
    if (SystemID != (xmlChar *)0x0) {
      pxVar1 = xmlStrdup(SystemID);
      doc_local->encoding = pxVar1;
      if (doc_local->encoding == (xmlChar *)0x0) goto LAB_00160da4;
    }
    if (doc != (xmlDocPtr)0x0) {
      doc->extSubset = (_xmlDtd *)doc_local;
    }
    doc_local->doc = doc;
    if ((xmlRegisterCallbacks != 0) &&
       (pp_Var2 = __xmlRegisterNodeDefaultValue(), *pp_Var2 != (xmlRegisterNodeFunc)0x0)) {
      pp_Var2 = __xmlRegisterNodeDefaultValue();
      (**pp_Var2)((xmlNodePtr)doc_local);
    }
  }
  else {
    pxVar1 = xmlStrdup(name);
    doc_local->name = (char *)pxVar1;
    if ((xmlChar *)doc_local->name != (xmlChar *)0x0) goto LAB_00160d05;
LAB_00160da4:
    xmlFreeDtd((xmlDtdPtr)doc_local);
    doc_local = (xmlDocPtr)0x0;
  }
  return (xmlDtdPtr)doc_local;
}

Assistant:

xmlDtdPtr
xmlNewDtd(xmlDocPtr doc, const xmlChar *name,
                    const xmlChar *ExternalID, const xmlChar *SystemID) {
    xmlDtdPtr cur;

    if ((doc != NULL) && (doc->extSubset != NULL)) {
	return(NULL);
    }

    /*
     * Allocate a new DTD and fill the fields.
     */
    cur = (xmlDtdPtr) xmlMalloc(sizeof(xmlDtd));
    if (cur == NULL)
	return(NULL);
    memset(cur, 0 , sizeof(xmlDtd));
    cur->type = XML_DTD_NODE;

    if (name != NULL) {
	cur->name = xmlStrdup(name);
        if (cur->name == NULL)
            goto error;
    }
    if (ExternalID != NULL) {
	cur->ExternalID = xmlStrdup(ExternalID);
        if (cur->ExternalID == NULL)
            goto error;
    }
    if (SystemID != NULL) {
	cur->SystemID = xmlStrdup(SystemID);
        if (cur->SystemID == NULL)
            goto error;
    }
    if (doc != NULL)
	doc->extSubset = cur;
    cur->doc = doc;

    if ((xmlRegisterCallbacks) && (xmlRegisterNodeDefaultValue))
	xmlRegisterNodeDefaultValue((xmlNodePtr)cur);
    return(cur);

error:
    xmlFreeDtd(cur);
    return(NULL);
}